

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  size_type sVar1;
  int iVar2;
  FilePath *path;
  long in_FS_OFFSET;
  bool bVar3;
  FilePath parent;
  FilePath local_d0;
  undefined1 local_b0 [144];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->pathname_)._M_string_length;
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = (this->pathname_)._M_dataplus._M_p[sVar1 - 1] == '/';
    if (bVar3 && sVar1 != 0) {
      iVar2 = stat((this->pathname_)._M_dataplus._M_p,(stat *)local_b0);
      if ((iVar2 != 0) || (bVar3 = true, (local_b0._24_4_ & 0xf000) != 0x4000)) {
        RemoveTrailingPathSeparator(&local_d0,this);
        RemoveFileName((FilePath *)local_b0,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.pathname_._M_dataplus._M_p != &local_d0.pathname_.field_2) {
          operator_delete(local_d0.pathname_._M_dataplus._M_p,
                          local_d0.pathname_.field_2._M_allocated_capacity + 1);
        }
        bVar3 = CreateDirectoriesRecursively((FilePath *)local_b0);
        if (bVar3) {
          bVar3 = CreateFolder(this);
        }
        else {
          bVar3 = false;
        }
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}